

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int blake2b_done(hash_state *md,uchar *out)

{
  int iVar1;
  void *in_RSI;
  hash_state *in_RDI;
  ulong64 __t;
  unsigned_long i;
  uchar buffer [64];
  uchar *in_stack_000000a8;
  hash_state *in_stack_000000b0;
  ulong local_60;
  undefined8 local_58 [8];
  void *local_18;
  hash_state *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_58,0,0x40);
  if (local_10 == (hash_state *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/blake2b.c",0x170)
    ;
  }
  if (local_18 == (void *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/blake2b.c",0x171)
    ;
  }
  iVar1 = blake2b_is_lastblock(local_10);
  if (iVar1 == 0) {
    blake2b_increment_counter(local_10,(local_10->blake2b).curlen);
    blake2b_set_lastblock((hash_state *)0x1f9d63);
    memset((void *)((long)local_10 + (local_10->blake2b).curlen + 0x60),0,
           0x80 - (local_10->blake2b).curlen);
    blake2b_compress(in_stack_000000b0,in_stack_000000a8);
    for (local_60 = 0; local_60 < 8; local_60 = local_60 + 1) {
      local_58[local_60] = *(undefined8 *)((long)local_10 + local_60 * 8);
    }
    memcpy(local_18,local_58,(local_10->blake2b).outlen);
    memset(local_10,0,0x1a0);
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int blake2b_done(hash_state *md, unsigned char *out)
{
   unsigned char buffer[BLAKE2B_OUTBYTES] = { 0 };
   unsigned long i;

   LTC_ARGCHK(md != NULL);
   LTC_ARGCHK(out != NULL);

   /* if(md->blakebs.outlen != outlen) return CRYPT_INVALID_ARG; */

   if (blake2b_is_lastblock(md))
      return CRYPT_ERROR;

   blake2b_increment_counter(md, md->blake2b.curlen);
   blake2b_set_lastblock(md);
   XMEMSET(md->blake2b.buf + md->blake2b.curlen, 0, BLAKE2B_BLOCKBYTES - md->blake2b.curlen); /* Padding */
   blake2b_compress(md, md->blake2b.buf);

   for (i = 0; i < 8; ++i) /* Output full hash to temp buffer */
      STORE64L(md->blake2b.h[i], buffer + i * 8);

   XMEMCPY(out, buffer, md->blake2b.outlen);
   zeromem(md, sizeof(hash_state));
#ifdef LTC_CLEAN_STACK
   zeromem(buffer, sizeof(buffer));
#endif
   return CRYPT_OK;
}